

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

int update_path_and_do(c2m_ctx_t c2m_ctx,int go_inside_p,
                      _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *action,size_t mark,
                      node_t_conflict value,int const_only_p,mir_llong *max_index,pos_t pos,
                      char *detail)

{
  uint uVar1;
  undefined4 uVar2;
  type_mode tVar3;
  byte *pbVar4;
  int *piVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  node_t pnVar9;
  c2m_ctx_t pcVar10;
  VARR_node_t *pVVar11;
  init_object_t *piVar12;
  node_t_conflict pnVar13;
  VARR_init_object_t *pVVar14;
  ulong uVar15;
  size_t sVar16;
  type **pptVar17;
  type *extraout_RDX;
  char *extraout_RDX_00;
  type *ptVar18;
  VARR_init_object_t *unaff_RBP;
  c2m_ctx_t pcVar19;
  decl_t pdVar20;
  c2m_ctx_t pcVar21;
  c2m_ctx_t pcVar22;
  anon_union_8_2_e4b0c9a5_for_u *paVar23;
  mir_llong mVar24;
  node_t pnVar25;
  pos_t p;
  long local_78;
  type *local_68;
  undefined8 uStack_60;
  node_t_conflict local_58;
  _func_void_c2m_ctx_t_decl_t_type_ptr_ptr_node_t_int_int *local_48;
  c2m_ctx_t local_40;
  node_t_conflict local_38;
  
  if (value->attr == (void *)0x0) {
    local_78 = 0;
  }
  else {
    local_78 = *(long *)((long)value->attr + 0x18);
  }
  if (go_inside_p == 0) {
    bVar7 = false;
  }
  else {
    bVar7 = value->code != N_COMPOUND_LITERAL && value->code != N_LIST;
  }
  pVVar14 = c2m_ctx->init_object_path;
  pcVar22 = c2m_ctx;
  local_48 = action;
  local_38 = value;
  do {
    if (pVVar14 == (VARR_init_object_t *)0x0) {
      update_path_and_do_cold_8();
LAB_001884f6:
      error(c2m_ctx,0x1bf808,pos.fname,pos._8_8_,detail);
      return 0;
    }
    sVar16 = pVVar14->els_num;
    local_40 = pcVar22;
LAB_0018825d:
    if (sVar16 == mark) goto LAB_001884f6;
    if ((sVar16 == 0) || (pcVar22 = (c2m_ctx_t)pVVar14->varr, pcVar22 == (c2m_ctx_t)0x0)) {
LAB_00188672:
      update_path_and_do_cold_7();
LAB_00188677:
      __assert_fail("declaration_list != NULL && declaration_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1cc4,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)");
    }
    pnVar25 = (node_t)pcVar22->env[0].__jmpbuf[sVar16 * 3 + -5];
    uVar1 = *(uint *)(pcVar22->env[0].__jmpbuf + sVar16 * 3 + -4);
    pcVar19 = (c2m_ctx_t)(ulong)uVar1;
    uVar2 = *(undefined4 *)((long)pcVar22->env[0].__jmpbuf + sVar16 * 0x18 + -0x1c);
    pcVar21 = (c2m_ctx_t)pcVar22->env[0].__jmpbuf[sVar16 * 3 + -3];
    iVar8 = *(int *)&(pnVar25->op_link).next;
    if (1 < iVar8 - 4U) {
      if (iVar8 != 6) {
        __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1cc0,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)");
      }
      ptVar18 = *(type **)(*(long *)(pnVar25 + 1) + 8);
      piVar5 = *(int **)(*(long *)(pnVar25 + 1) + 0x18);
      if ((*piVar5 == 0) || (pbVar4 = *(byte **)(piVar5 + 2), (*pbVar4 & 1) == 0)) {
LAB_001883e3:
        pnVar9 = (node_t)((long)&pcVar21->ctx + 1);
        goto LAB_001883e6;
      }
      iVar8 = *(int *)(*(long *)(pbVar4 + 0x18) + 0x18);
      if ((iVar8 != 2) &&
         ((iVar8 != 1 || (*(int *)(*(long *)(pbVar4 + 0x18) + 0x30) - 0xeU < 0xfffffff4))))
      goto LAB_001883e3;
      pcVar22 = *(c2m_ctx_t *)(pbVar4 + 0x30);
      pnVar9 = (node_t)((long)&pcVar21->ctx + 1);
      if (((long)pcVar22 < 0) || ((long)pnVar9 < (long)pcVar22)) goto LAB_001883d1;
LAB_0018835c:
      sVar16 = sVar16 - 1;
      pVVar14->els_num = sVar16;
      goto LAB_0018825d;
    }
    if (pcVar21 == (c2m_ctx_t)0x0) {
      if (((*(long *)(*(long *)(pnVar25 + 1) + 0x20) == 0) ||
          (piVar5 = *(int **)(*(long *)(*(long *)(pnVar25 + 1) + 0x20) + 0x18), piVar5 == (int *)0x0
          )) || (*piVar5 != 0x54)) goto LAB_00188677;
      for (pnVar9 = *(node_t *)(piVar5 + 8); pnVar9 != (node_t)0x0; pnVar9 = (pnVar9->op_link).next)
      {
        if ((pnVar9->code == N_MEMBER) &&
           ((((((pnVar9->u).ops.head)->op_link).next)->code != N_IGNORE ||
            ((pnVar9->attr != (void *)0x0 &&
             (*(char *)(*(long *)((long)pnVar9->attr + 0x40) + 0x1d) != '\0'))))))
        goto LAB_001883c7;
      }
LAB_001882d1:
      if ((pVVar14 != (VARR_init_object_t *)0x0) && (pVVar14->varr != (init_object_t *)0x0))
      goto LAB_001882e5;
LAB_0018866d:
      update_path_and_do_cold_1();
      goto LAB_00188672;
    }
    if (iVar8 == 5 && uVar1 == 0) {
LAB_001882e5:
      sVar16 = pVVar14->els_num;
      if (sVar16 != 0) goto LAB_0018835c;
      goto LAB_0018866d;
    }
    pnVar9 = get_adjacent_member((node_t_conflict)pcVar21,1);
    pVVar14 = c2m_ctx->init_object_path;
    pcVar22 = pcVar21;
    if (pnVar9 == (node_t_conflict)0x0) goto LAB_001882d1;
LAB_001883c7:
    pcVar19 = (c2m_ctx_t)0x0;
    ptVar18 = *(type **)((long)pnVar9->attr + 0x40);
LAB_001883d1:
    if (pVVar14 == (VARR_init_object_t *)0x0) {
LAB_001886de:
      update_path_and_do_cold_2();
LAB_001886e3:
      max_index = (mir_llong *)pcVar19;
      update_path_and_do_cold_6();
LAB_001886e8:
      update_path_and_do_cold_5();
      if (*(node_code_t *)&((c2m_ctx_t)max_index)->ctx != N_MEMBER) goto LAB_0018881e;
      pVVar14 = pcVar22->init_object_path;
      if (pVVar14 == (VARR_init_object_t *)0x0) {
        process_init_field_designator_cold_8();
        goto LAB_00188842;
      }
      sVar16 = pVVar14->els_num;
      ptVar18 = extraout_RDX;
      pcVar21 = pcVar22;
      if (sVar16 == 0) goto LAB_0018876f;
      pcVar21 = (c2m_ctx_t)(sVar16 * 3);
      paVar23 = &pVVar14->varr[sVar16 - 1].u;
      break;
    }
    sVar16 = pVVar14->els_num;
    pcVar22 = (c2m_ctx_t)pVVar14->varr;
LAB_001883e6:
    pnVar13 = local_38;
    if ((pcVar22 == (c2m_ctx_t)0x0) || (sVar16 == 0)) {
      update_path_and_do_cold_3();
      goto LAB_001886ba;
    }
    pcVar22->env[0].__jmpbuf[sVar16 * 3 + -5] = (long)pnVar25;
    *(int *)(pcVar22->env[0].__jmpbuf + sVar16 * 3 + -4) = (int)pcVar19;
    *(undefined4 *)((long)pcVar22->env[0].__jmpbuf + sVar16 * 0x18 + -0x1c) = uVar2;
    pcVar22->env[0].__jmpbuf[sVar16 * 3 + -3] = (long)pnVar9;
    if ((!bVar7) || (tVar3 = ptVar18->mode, tVar3 - TM_ENUM < 2)) {
LAB_00188543:
      if (go_inside_p == 0) {
        return 1;
      }
      pVVar14 = c2m_ctx->init_object_path;
      if (((pVVar14 == (VARR_init_object_t *)0x0) ||
          (piVar12 = pVVar14->varr, piVar12 == (init_object_t *)0x0)) ||
         (sVar16 = pVVar14->els_num, sVar16 == 0)) goto LAB_001886e3;
      local_68 = piVar12[sVar16 - 1].container_type;
      uStack_60 = *(undefined8 *)&piVar12[sVar16 - 1].field_designator_p;
      local_58 = piVar12[sVar16 - 1].u.curr_member;
      if (local_68->mode - TM_STRUCT < 2) {
        pdVar20 = (decl_t)local_58->attr;
        pptVar17 = &(pdVar20->decl_spec).type;
LAB_001885e9:
        pcVar22 = c2m_ctx;
        (*local_48)(c2m_ctx,pdVar20,pptVar17,pnVar13,const_only_p,0);
      }
      else if (local_68->mode == TM_ARR) {
        ptVar18 = (local_68->u).ptr_type;
        iVar8 = init_compatible_string_p((node_t_conflict)(ulong)local_38->code,ptVar18->arr_type);
        pptVar17 = &local_68;
        if (iVar8 == 0) {
          pptVar17 = &ptVar18->arr_type;
        }
        pdVar20 = (decl_t)0x0;
        c2m_ctx = local_40;
        goto LAB_001885e9;
      }
      if (max_index == (mir_llong *)0x0) {
        return 1;
      }
      pVVar14 = c2m_ctx->init_object_path;
      if (((pVVar14 != (VARR_init_object_t *)0x0) &&
          (piVar12 = pVVar14->varr, piVar12 != (init_object_t *)0x0)) && (mark < pVVar14->els_num))
      {
        if ((piVar12[mark].container_type)->mode != TM_ARR) {
          return 1;
        }
        if (piVar12[mark].u.curr_index <= *max_index) {
          return 1;
        }
        *max_index = piVar12[mark].u.curr_index;
        return 1;
      }
      goto LAB_001886e8;
    }
    if (tVar3 == TM_BASIC) {
      if (0xf < (ptVar18->u).basic_type - TP_VOID) goto LAB_001886ba;
      goto LAB_00188543;
    }
    if (2 < tVar3 - TM_STRUCT) {
LAB_001886ba:
      __assert_fail("el_type->mode == TM_ARR || el_type->mode == TM_STRUCT || el_type->mode == TM_UNION"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1cdd,"int update_init_object_path(c2m_ctx_t, size_t, struct type *, int)");
    }
    if ((local_78 == 0) || (tVar3 == TM_ARR)) {
      mVar24 = -1;
      if (tVar3 != TM_ARR) goto LAB_0018846c;
    }
    else {
      if ((ptVar18->u).tag_type == *(node_t_conflict *)(local_78 + 0x30)) goto LAB_00188543;
LAB_0018846c:
      mVar24 = 0;
    }
    unaff_RBP = c2m_ctx->init_object_path;
    piVar12 = unaff_RBP->varr;
    if (piVar12 == (init_object_t *)0x0) {
      update_path_and_do_cold_4();
      goto LAB_001886de;
    }
    sVar16 = unaff_RBP->els_num;
    uVar15 = sVar16 + 1;
    if (unaff_RBP->size < uVar15) {
      sVar16 = (uVar15 >> 1) + uVar15;
      piVar12 = (init_object_t *)realloc(piVar12,sVar16 * 0x18);
      unaff_RBP->varr = piVar12;
      unaff_RBP->size = sVar16;
      sVar16 = unaff_RBP->els_num;
      uVar15 = sVar16 + 1;
      c2m_ctx = local_40;
    }
    unaff_RBP->els_num = uVar15;
    piVar12[sVar16].container_type = ptVar18;
    piVar12[sVar16].field_designator_p = 0;
    *(undefined4 *)&piVar12[sVar16].field_0xc = uVar2;
    piVar12[sVar16].u.curr_index = mVar24;
    pVVar14 = c2m_ctx->init_object_path;
    pcVar22 = local_40;
  } while( true );
  while( true ) {
    ptVar18 = ((init_object_t *)(paVar23 + -2))->container_type;
    pVVar14->els_num = sVar16;
    paVar23 = paVar23 + -3;
    if (sVar16 == 0) break;
    sVar16 = sVar16 - 1;
    if (pVVar14->varr == (init_object_t *)0x0) goto LAB_00188819;
    unaff_RBP = (VARR_init_object_t *)(ulong)*(uint *)((long)paVar23 + -4);
    if (((*(int *)(paVar23 + -1) == 0) ||
        (pcVar21 = (c2m_ctx_t)paVar23->curr_member->attr, pcVar21 == (c2m_ctx_t)0x0)) ||
       (pcVar21 = (c2m_ctx_t)pcVar21->env[0].__jmpbuf[6],
       *(char *)((long)pcVar21->env[0].__jmpbuf + 0xd) == '\0')) break;
  }
LAB_0018876f:
  pVVar11 = pcVar22->containing_anon_members;
  if (pVVar11 == (VARR_node_t *)0x0) {
LAB_00188842:
    process_init_field_designator_cold_7();
  }
  else if (pVVar11->els_num == 0) {
    pnVar25 = (node_t)((c2m_ctx_t)max_index)->options->macro_commands_num;
    pcVar19 = (c2m_ctx_t)max_index;
    if (pnVar25 == (node_t)0x0) goto LAB_00188876;
    do {
      pVVar11 = pcVar22->containing_anon_members;
      pcVar10 = (c2m_ctx_t)pVVar11->varr;
      if (pcVar10 == (c2m_ctx_t)0x0) {
        process_init_field_designator_cold_2();
LAB_00188819:
        process_init_field_designator_cold_1();
LAB_0018881e:
        __assert_fail("designator_member->code == N_MEMBER",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x1daa,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)"
                     );
      }
      sVar16 = pVVar11->els_num;
      pvVar6 = pnVar25->attr;
      uVar15 = sVar16 + 1;
      if (pVVar11->size < uVar15) {
        unaff_RBP = (VARR_init_object_t *)((ulong)unaff_RBP & 0xffffffff);
        sVar16 = (uVar15 >> 1) + uVar15;
        pcVar19 = (c2m_ctx_t)(sVar16 * 8);
        pcVar21 = pcVar10;
        pcVar10 = (c2m_ctx_t)realloc(pcVar10,(size_t)pcVar19);
        pVVar11->varr = (node_t_conflict *)pcVar10;
        pVVar11->size = sVar16;
        sVar16 = pVVar11->els_num;
        uVar15 = sVar16 + 1;
      }
      pVVar11->els_num = uVar15;
      pcVar10->env[0].__jmpbuf[sVar16 - 2] = (long)pnVar25;
      pnVar25 = *(node_t *)((long)pvVar6 + 0x48);
    } while (pnVar25 != (node_t)0x0);
    do {
      pVVar11 = pcVar22->containing_anon_members;
      if (pVVar11 == (VARR_node_t *)0x0) {
        process_init_field_designator_cold_3();
LAB_0018899d:
        process_init_field_designator_cold_5();
LAB_001889a2:
        max_index = (mir_llong *)pcVar21;
        process_init_field_designator_cold_4();
LAB_001889a7:
        process_init_field_designator_cold_6();
        pnVar13 = new_node((c2m_ctx_t)max_index,N_L);
        p.lno = (int)uVar15;
        p.ln_pos = (int)(uVar15 >> 0x20);
        p.fname = extraout_RDX_00;
        add_pos((c2m_ctx_t)max_index,pnVar13,p);
        (pnVar13->u).s.s = (char *)pcVar19;
        return (int)pnVar13;
      }
LAB_00188876:
      uVar15 = pVVar11->els_num;
      if (uVar15 == 0) {
        pcVar19 = (c2m_ctx_t)0x0;
        pnVar13 = get_adjacent_member((node_t_conflict)max_index,0);
        pVVar14 = pcVar22->init_object_path;
        piVar12 = pVVar14->varr;
        if (piVar12 != (init_object_t *)0x0) {
          sVar16 = pVVar14->els_num;
          uVar15 = sVar16 + 1;
          if (pVVar14->size < uVar15) {
            sVar16 = (uVar15 >> 1) + uVar15;
            piVar12 = (init_object_t *)realloc(piVar12,sVar16 * 0x18);
            pVVar14->varr = piVar12;
            pVVar14->size = sVar16;
            sVar16 = pVVar14->els_num;
            uVar15 = sVar16 + 1;
          }
          pVVar14->els_num = uVar15;
          piVar12[sVar16].container_type = ptVar18;
          piVar12[sVar16].field_designator_p = 1;
          *(int *)&piVar12[sVar16].field_0xc = (int)unaff_RBP;
          piVar12[sVar16].u.curr_member = pnVar13;
          return (int)piVar12;
        }
        goto LAB_001889a7;
      }
      if (pVVar11->varr == (node_t_conflict *)0x0) goto LAB_0018899d;
      pcVar19 = (c2m_ctx_t)(uVar15 - 1);
      pVVar11->els_num = (size_t)pcVar19;
      pVVar14 = pcVar22->init_object_path;
      pcVar10 = (c2m_ctx_t)pVVar14->varr;
      if (pcVar10 == (c2m_ctx_t)0x0) goto LAB_001889a2;
      pnVar25 = pVVar11->varr[uVar15 - 1];
      sVar16 = pVVar14->els_num;
      uVar15 = sVar16 + 1;
      if (pVVar14->size < uVar15) {
        sVar16 = (uVar15 >> 1) + uVar15;
        pcVar19 = (c2m_ctx_t)(sVar16 * 0x18);
        pcVar21 = pcVar10;
        pcVar10 = (c2m_ctx_t)realloc(pcVar10,(size_t)pcVar19);
        pVVar14->varr = (init_object_t *)pcVar10;
        pVVar14->size = sVar16;
        sVar16 = pVVar14->els_num;
        uVar15 = sVar16 + 1;
      }
      pVVar14->els_num = uVar15;
      uVar15 = sVar16 * 3;
      pcVar10->env[0].__jmpbuf[sVar16 * 3 + -2] = (long)ptVar18;
      *(undefined4 *)(pcVar10->env[0].__jmpbuf + sVar16 * 3 + -1) = 0;
      *(int *)((long)pcVar10->env[0].__jmpbuf + sVar16 * 0x18 + -4) = (int)unaff_RBP;
      pcVar10->env[0].__jmpbuf[sVar16 * 3] = (long)pnVar25;
      ptVar18 = *(type **)((long)pnVar25->attr + 0x40);
    } while( true );
  }
  __assert_fail("VARR_LENGTH (node_t, containing_anon_members) == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                ,0x1db6,"void process_init_field_designator(c2m_ctx_t, node_t, struct type *)");
}

Assistant:

static int update_path_and_do (c2m_ctx_t c2m_ctx, int go_inside_p,
                               void (*action) (c2m_ctx_t c2m_ctx, decl_t member_decl,
                                               struct type **type_ptr, node_t initializer,
                                               int const_only_p, int top_p),
                               size_t mark, node_t value, int const_only_p, mir_llong *max_index,
                               pos_t pos, const char *detail) {
  init_object_t init_object;
  mir_llong index;
  struct type *el_type;
  struct expr *value_expr = value->attr;

  if (!update_init_object_path (c2m_ctx, mark, value_expr == NULL ? NULL : value_expr->type,
                                !go_inside_p || value->code == N_LIST
                                  || value->code == N_COMPOUND_LITERAL)) {
    error (c2m_ctx, pos, "excess elements in %s initializer", detail);
    return FALSE;
  }
  if (!go_inside_p) return TRUE;
  init_object = VARR_LAST (init_object_t, init_object_path);
  if (init_object.container_type->mode == TM_ARR) {
    el_type = init_object.container_type->u.arr_type->el_type;
    action (c2m_ctx, NULL,
            (init_compatible_string_p (value, el_type)
               ? &init_object.container_type
               : &init_object.container_type->u.arr_type->el_type),
            value, const_only_p, FALSE);
  } else if (init_object.container_type->mode == TM_STRUCT
             || init_object.container_type->mode == TM_UNION) {
    action (c2m_ctx, (decl_t) init_object.u.curr_member->attr,
            &((decl_t) init_object.u.curr_member->attr)->decl_spec.type, value, const_only_p,
            FALSE);
  }
  if (max_index != NULL) {
    init_object = VARR_GET (init_object_t, init_object_path, mark);
    if (init_object.container_type->mode == TM_ARR
        && *max_index < (index = init_object.u.curr_index))
      *max_index = index;
  }
  return TRUE;
}